

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtrans.c
# Opt level: O1

void png_do_check_palette_indexes(png_structrp png_ptr,png_row_infop row_info)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  byte *pbVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  bVar1 = row_info->bit_depth;
  if (((int)(uint)png_ptr->num_palette < 1 << (bVar1 & 0x1f) && png_ptr->num_palette != 0) &&
     (bVar1 - 1 < 8)) {
    uVar5 = -((uint)row_info->pixel_depth * row_info->width) & 7;
    pbVar2 = png_ptr->row_buf;
    pbVar8 = pbVar2 + (row_info->rowbytes - 1);
    switch((uint)bVar1) {
    case 1:
      for (; pbVar2 < pbVar8; pbVar8 = pbVar8 + -1) {
        if (*pbVar8 >> (sbyte)uVar5 != 0) {
          png_ptr->num_palette_max = 1;
        }
        uVar5 = 0;
      }
      break;
    case 2:
      if (pbVar2 < pbVar8) {
        uVar4 = png_ptr->num_palette_max;
        do {
          bVar1 = *pbVar8 >> (sbyte)uVar5;
          uVar10 = bVar1 & 3;
          uVar5 = uVar10;
          if ((int)uVar10 <= (int)uVar4) {
            uVar5 = uVar4;
          }
          uVar11 = bVar1 >> 2 & 3;
          uVar12 = uVar11;
          if (uVar11 <= uVar5) {
            uVar12 = uVar5;
          }
          uVar6 = bVar1 >> 4 & 3;
          uVar7 = uVar6;
          if (uVar6 <= uVar12) {
            uVar7 = uVar12;
          }
          uVar9 = (uint)(bVar1 >> 6);
          uVar13 = uVar9;
          if (uVar9 <= uVar7) {
            uVar13 = uVar7;
          }
          if (((((int)uVar4 < (int)uVar10) || (uVar5 < uVar11)) || (uVar12 < uVar6)) ||
             (uVar7 < uVar9)) {
            png_ptr->num_palette_max = uVar13;
          }
          pbVar8 = pbVar8 + -1;
          uVar5 = 0;
          uVar4 = uVar13;
        } while (pbVar2 < pbVar8);
      }
      break;
    case 4:
      if (pbVar2 < pbVar8) {
        uVar4 = png_ptr->num_palette_max;
        do {
          bVar1 = *pbVar8 >> (sbyte)uVar5;
          uVar5 = bVar1 & 0xf;
          bVar3 = (int)uVar4 < (int)uVar5;
          if ((int)uVar5 <= (int)uVar4) {
            uVar5 = uVar4;
          }
          uVar10 = (uint)(bVar1 >> 4);
          uVar4 = uVar10;
          if (uVar10 <= uVar5) {
            uVar4 = uVar5;
          }
          if (bVar3 || uVar5 < uVar10) {
            png_ptr->num_palette_max = uVar4;
          }
          pbVar8 = pbVar8 + -1;
          uVar5 = 0;
        } while (pbVar2 < pbVar8);
      }
      break;
    case 8:
      if (pbVar2 < pbVar8) {
        uVar5 = png_ptr->num_palette_max;
        do {
          if ((int)uVar5 < (int)(uint)*pbVar8) {
            uVar5 = (uint)*pbVar8;
            png_ptr->num_palette_max = uVar5;
          }
          pbVar8 = pbVar8 + -1;
        } while (pbVar2 < pbVar8);
      }
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_check_palette_indexes(png_structrp png_ptr, png_row_infop row_info)
{
   if (png_ptr->num_palette < (1 << row_info->bit_depth) &&
      png_ptr->num_palette > 0) /* num_palette can be 0 in MNG files */
   {
      /* Calculations moved outside switch in an attempt to stop different
       * compiler warnings.  'padding' is in *bits* within the last byte, it is
       * an 'int' because pixel_depth becomes an 'int' in the expression below,
       * and this calculation is used because it avoids warnings that other
       * forms produced on either GCC or MSVC.
       */
      int padding = PNG_PADBITS(row_info->pixel_depth, row_info->width);
      png_bytep rp = png_ptr->row_buf + row_info->rowbytes - 1;

      switch (row_info->bit_depth)
      {
         case 1:
         {
            /* in this case, all bytes must be 0 so we don't need
             * to unpack the pixels except for the rightmost one.
             */
            for (; rp > png_ptr->row_buf; rp--)
            {
              if ((*rp >> padding) != 0)
                 png_ptr->num_palette_max = 1;
              padding = 0;
            }

            break;
         }

         case 2:
         {
            for (; rp > png_ptr->row_buf; rp--)
            {
              int i = ((*rp >> padding) & 0x03);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              i = (((*rp >> padding) >> 2) & 0x03);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              i = (((*rp >> padding) >> 4) & 0x03);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              i = (((*rp >> padding) >> 6) & 0x03);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              padding = 0;
            }

            break;
         }

         case 4:
         {
            for (; rp > png_ptr->row_buf; rp--)
            {
              int i = ((*rp >> padding) & 0x0f);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              i = (((*rp >> padding) >> 4) & 0x0f);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              padding = 0;
            }

            break;
         }

         case 8:
         {
            for (; rp > png_ptr->row_buf; rp--)
            {
               if (*rp > png_ptr->num_palette_max)
                  png_ptr->num_palette_max = (int) *rp;
            }

            break;
         }

         default:
            break;
      }
   }
}